

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O2

Vec_Int_t * Gia_AigerReadLiterals(uchar **ppPos,int nEntries)

{
  uint Entry;
  uint uVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  
  p = Vec_IntAlloc(nEntries);
  Entry = Gia_AigerReadUnsigned(ppPos);
  Vec_IntPush(p,Entry);
  for (iVar3 = 1; iVar3 < nEntries; iVar3 = iVar3 + 1) {
    uVar1 = Gia_AigerReadUnsigned(ppPos);
    iVar2 = -((int)uVar1 >> 1);
    if ((uVar1 & 1) == 0) {
      iVar2 = (int)uVar1 >> 1;
    }
    Entry = Entry + iVar2;
    Vec_IntPush(p,Entry);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_AigerReadLiterals( unsigned char ** ppPos, int nEntries )
{
    Vec_Int_t * vLits;
    int Lit, LitPrev, Diff, i;
    vLits = Vec_IntAlloc( nEntries );
    LitPrev = Gia_AigerReadUnsigned( ppPos );
    Vec_IntPush( vLits, LitPrev );
    for ( i = 1; i < nEntries; i++ )
    {
//        Diff = Lit - LitPrev;
//        Diff = (Lit < LitPrev)? -Diff : Diff;
//        Diff = ((2 * Diff) << 1) | (int)(Lit < LitPrev);
        Diff = Gia_AigerReadUnsigned( ppPos );
        Diff = (Diff & 1)? -(Diff >> 1) : Diff >> 1;
        Lit  = Diff + LitPrev;
        Vec_IntPush( vLits, Lit );
        LitPrev = Lit;
    }
    return vLits;
}